

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

void spr_write_ebb(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  int gprn_local;
  int sprn_local;
  DisasContext_conflict10 *ctx_local;
  
  gen_fscr_facility_check(ctx,0x99,7,sprn,7);
  spr_write_generic(ctx,sprn,gprn);
  return;
}

Assistant:

static void spr_write_ebb(DisasContext *ctx, int sprn, int gprn)
{
    gen_fscr_facility_check(ctx, SPR_FSCR, FSCR_EBB, sprn, FSCR_IC_EBB);
    spr_write_generic(ctx, sprn, gprn);
}